

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_equals_similar_Test::TestBody
          (HeartbeatMessageTest_test_equals_similar_Test *this)

{
  char *message;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar;
  HeartbeatMessage message2;
  HeartbeatMessage message1;
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage(&message1);
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage(&message2);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::HeartbeatMessage,bidfx_public_api::price::pixie::HeartbeatMessage>
            ((internal *)&gtest_ar,"message1","message2",&message1,&message2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_equals_similar)
{
    HeartbeatMessage message1;
    HeartbeatMessage message2;
    EXPECT_EQ(message1, message2);
}